

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool IsBlockMutated(CBlock *block,bool check_witness_root)

{
  long lVar1;
  bool bVar2;
  _Iter_pred<IsBlockMutated(CBlock_const&,bool)::__0> *this;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it;
  long lVar3;
  long lVar4;
  _Iter_pred<IsBlockMutated(CBlock_const&,bool)::__0> *p_Var5;
  _Iter_pred<IsBlockMutated(CBlock_const&,bool)::__0> *p_Var6;
  long in_FS_OFFSET;
  bool bVar7;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  string sStack_98;
  BlockValidationState state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  __it._M_current = (shared_ptr<const_CTransaction> *)&state;
  bVar2 = CheckMerkleRoot(block,(BlockValidationState *)__it._M_current);
  if (!bVar2) {
    bVar2 = LogAcceptCategory(VALIDATION,Debug);
    bVar7 = true;
    if (!bVar2) goto LAB_00364b57;
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&sStack_98,&state.super_ValidationState<BlockValidationResult>);
    logging_function._M_str = "IsBlockMutated";
    logging_function._M_len = 0xe;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x1008,VALIDATION,Debug,
               (ConstevalFormatString<1U>)0x6c465c,&sStack_98);
LAB_00364a19:
    bVar7 = true;
    std::__cxx11::string::~string((string *)&sStack_98);
    goto LAB_00364b57;
  }
  this = (_Iter_pred<IsBlockMutated(CBlock_const&,bool)::__0> *)
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  p_Var6 = this;
  if (this != (_Iter_pred<IsBlockMutated(CBlock_const&,bool)::__0> *)
              (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = CTransaction::IsCoinBase(*(CTransaction **)this);
    if (bVar2) {
      bVar2 = CheckWitnessMalleation(block,check_witness_root,&state);
      if (bVar2) {
        bVar7 = false;
        goto LAB_00364b57;
      }
      bVar2 = LogAcceptCategory(VALIDATION,Debug);
      bVar7 = true;
      if (!bVar2) goto LAB_00364b57;
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&sStack_98,&state.super_ValidationState<BlockValidationResult>);
      logging_function_00._M_str = "IsBlockMutated";
      logging_function_00._M_len = 0xe;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,source_file_00,0x101c,VALIDATION,Debug,
                 (ConstevalFormatString<1U>)0x6c465c,&sStack_98);
      goto LAB_00364a19;
    }
    this = (_Iter_pred<IsBlockMutated(CBlock_const&,bool)::__0> *)
           (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    p_Var6 = (_Iter_pred<IsBlockMutated(CBlock_const&,bool)::__0> *)
             (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  lVar3 = (long)p_Var6 - (long)this;
  for (lVar4 = lVar3 >> 6; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<IsBlockMutated(CBlock_const&,bool)::$_0>::operator()
                      (this,__it);
    p_Var5 = this;
    if (bVar2) goto LAB_00364b51;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<IsBlockMutated(CBlock_const&,bool)::$_0>::operator()
                      (this + 0x10,__it);
    p_Var5 = this + 0x10;
    if (bVar2) goto LAB_00364b51;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<IsBlockMutated(CBlock_const&,bool)::$_0>::operator()
                      (this + 0x20,__it);
    p_Var5 = this + 0x20;
    if (bVar2) goto LAB_00364b51;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<IsBlockMutated(CBlock_const&,bool)::$_0>::operator()
                      (this + 0x30,__it);
    p_Var5 = this + 0x30;
    if (bVar2) goto LAB_00364b51;
    this = this + 0x40;
    lVar3 = lVar3 + -0x40;
  }
  lVar3 = lVar3 >> 4;
  if (lVar3 == 1) {
LAB_00364b40:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<IsBlockMutated(CBlock_const&,bool)::$_0>::operator()
                      (this,__it);
    p_Var5 = this;
    if (!bVar2) {
      p_Var5 = p_Var6;
    }
  }
  else if (lVar3 == 2) {
LAB_00364b30:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<IsBlockMutated(CBlock_const&,bool)::$_0>::operator()
                      (this,__it);
    p_Var5 = this;
    if (!bVar2) {
      this = this + 0x10;
      goto LAB_00364b40;
    }
  }
  else {
    p_Var5 = p_Var6;
    if ((lVar3 == 3) &&
       (bVar2 = __gnu_cxx::__ops::_Iter_pred<IsBlockMutated(CBlock_const&,bool)::$_0>::operator()
                          (this,__it), p_Var5 = this, !bVar2)) {
      this = this + 0x10;
      goto LAB_00364b30;
    }
  }
LAB_00364b51:
  bVar7 = p_Var5 != p_Var6;
LAB_00364b57:
  ValidationState<BlockValidationResult>::~ValidationState
            (&state.super_ValidationState<BlockValidationResult>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool IsBlockMutated(const CBlock& block, bool check_witness_root)
{
    BlockValidationState state;
    if (!CheckMerkleRoot(block, state)) {
        LogDebug(BCLog::VALIDATION, "Block mutated: %s\n", state.ToString());
        return true;
    }

    if (block.vtx.empty() || !block.vtx[0]->IsCoinBase()) {
        // Consider the block mutated if any transaction is 64 bytes in size (see 3.1
        // in "Weaknesses in Bitcoin’s Merkle Root Construction":
        // https://lists.linuxfoundation.org/pipermail/bitcoin-dev/attachments/20190225/a27d8837/attachment-0001.pdf).
        //
        // Note: This is not a consensus change as this only applies to blocks that
        // don't have a coinbase transaction and would therefore already be invalid.
        return std::any_of(block.vtx.begin(), block.vtx.end(),
                           [](auto& tx) { return GetSerializeSize(TX_NO_WITNESS(tx)) == 64; });
    } else {
        // Theoretically it is still possible for a block with a 64 byte
        // coinbase transaction to be mutated but we neglect that possibility
        // here as it requires at least 224 bits of work.
    }

    if (!CheckWitnessMalleation(block, check_witness_root, state)) {
        LogDebug(BCLog::VALIDATION, "Block mutated: %s\n", state.ToString());
        return true;
    }

    return false;
}